

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.cpp
# Opt level: O0

string * format(string *__return_storage_ptr__,string *fmt,int arg1,double arg2)

{
  allocator<char> local_111;
  string local_110;
  string local_f0;
  string local_d0;
  allocator<char> local_a9;
  string local_a8;
  string local_88;
  allocator<char> local_51;
  string local_50;
  undefined1 local_29;
  double local_28;
  double arg2_local;
  string *psStack_18;
  int arg1_local;
  string *fmt_local;
  string *output;
  
  local_29 = 0;
  local_28 = arg2;
  arg2_local._4_4_ = arg1;
  psStack_18 = fmt;
  fmt_local = __return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)fmt);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"{1}",&local_51);
  format_abi_cxx11_(&local_88,arg2_local._4_4_);
  replace_positional(__return_storage_ptr__,&local_50,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"{2}",&local_a9);
  format_abi_cxx11_(&local_f0,local_28,6,3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_110," ",&local_111);
  trim(&local_d0,&local_f0,&local_110);
  replace_positional(__return_storage_ptr__,&local_a8,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator(&local_111);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator(&local_a9);
  return __return_storage_ptr__;
}

Assistant:

const std::string format (
  const std::string& fmt,
  int arg1,
  double arg2)
{
  std::string output = fmt;
  replace_positional (output, "{1}", format (arg1));
  replace_positional (output, "{2}", trim (format (arg2, 6, 3)));
  return output;
}